

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_money.cpp
# Opt level: O3

money_t * money_new(int amount,char *currency)

{
  money_t *pmVar1;
  
  pmVar1 = (money_t *)calloc(1,0x14);
  if (pmVar1 != (money_t *)0x0) {
    strcpy(pmVar1->currency,currency);
    pmVar1->currency[0xf] = '\0';
    pmVar1->amount = amount;
  }
  return pmVar1;
}

Assistant:

static money_t *
money_new(int amount, char const *currency)
{
    money_t *self =NULL;

    self = (money_t*)calloc(1, sizeof(money_t));
    if ( self == NULL )
    {
        return NULL;
    }

    strcpy(self->currency, currency);
    self->currency[MONEY_MAX_CURR_LEN-1] = '\0';

    self->amount = amount;

    return self;
}